

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdflib.c
# Opt level: O0

int by_encoding(void *a,void *b)

{
  bdf_glyph_t *c2;
  bdf_glyph_t *c1;
  void *b_local;
  void *a_local;
  
  if (*(ulong *)((long)a + 8) < *(ulong *)((long)b + 8)) {
    a_local._4_4_ = -1;
  }
  else if (*(ulong *)((long)b + 8) < *(ulong *)((long)a + 8)) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

FT_COMPARE_DEF( int )
  by_encoding( const void*  a,
               const void*  b )
  {
    bdf_glyph_t  *c1, *c2;


    c1 = (bdf_glyph_t *)a;
    c2 = (bdf_glyph_t *)b;

    if ( c1->encoding < c2->encoding )
      return -1;

    if ( c1->encoding > c2->encoding )
      return 1;

    return 0;
  }